

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::rotr(APInt *this,uint rotateAmt)

{
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  undefined4 in_register_00000034;
  APInt AVar2;
  APInt local_40;
  APInt local_30;
  uint local_1c;
  APInt *pAStack_18;
  uint rotateAmt_local;
  APInt *this_local;
  
  pAStack_18 = (APInt *)CONCAT44(in_register_00000034,rotateAmt);
  local_1c = in_EDX % pAStack_18->BitWidth;
  this_local = this;
  if (local_1c == 0) {
    APInt(this,pAStack_18);
    uVar1 = extraout_RDX;
  }
  else {
    lshr(&local_30,rotateAmt);
    shl(&local_40,rotateAmt);
    operator|((llvm *)this,&local_30,&local_40);
    ~APInt(&local_40);
    ~APInt(&local_30);
    uVar1 = extraout_RDX_00;
  }
  AVar2._8_8_ = uVar1;
  AVar2.U.pVal = (uint64_t *)this;
  return AVar2;
}

Assistant:

APInt APInt::rotr(unsigned rotateAmt) const {
  rotateAmt %= BitWidth;
  if (rotateAmt == 0)
    return *this;
  return lshr(rotateAmt) | shl(BitWidth - rotateAmt);
}